

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# where_binder.cpp
# Opt level: O2

void __thiscall
duckdb::WhereBinder::WhereBinder
          (WhereBinder *this,Binder *binder,ClientContext *context,
          optional_ptr<duckdb::ColumnAliasBinder,_true> column_alias_binder)

{
  LogicalType LStack_28;
  
  ExpressionBinder::ExpressionBinder(&this->super_ExpressionBinder,binder,context,false);
  (this->super_ExpressionBinder)._vptr_ExpressionBinder =
       (_func_int **)&PTR__ExpressionBinder_0178b8e0;
  (this->column_alias_binder).ptr = column_alias_binder.ptr;
  LogicalType::LogicalType(&LStack_28,BOOLEAN);
  LogicalType::operator=(&(this->super_ExpressionBinder).target_type,&LStack_28);
  LogicalType::~LogicalType(&LStack_28);
  return;
}

Assistant:

WhereBinder::WhereBinder(Binder &binder, ClientContext &context, optional_ptr<ColumnAliasBinder> column_alias_binder)
    : ExpressionBinder(binder, context), column_alias_binder(column_alias_binder) {
	target_type = LogicalType(LogicalTypeId::BOOLEAN);
}